

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageChannel.cpp
# Opt level: O0

void __thiscall
Imf_3_2::TypedFlatImageChannel<float>::resetBasePointer(TypedFlatImageChannel<float> *this)

{
  int iVar1;
  int iVar2;
  _func_int **pp_Var3;
  int iVar4;
  int iVar5;
  int iVar6;
  ImageLevel *pIVar7;
  Box2i *pBVar8;
  ImageChannel *in_RDI;
  
  pp_Var3 = in_RDI[1]._vptr_ImageChannel;
  pIVar7 = ImageChannel::level(in_RDI);
  pBVar8 = ImageLevel::dataWindow(pIVar7);
  iVar1 = (pBVar8->min).y;
  iVar4 = ImageChannel::ySampling(in_RDI);
  iVar5 = ImageChannel::pixelsPerRow(in_RDI);
  pIVar7 = ImageChannel::level(in_RDI);
  pBVar8 = ImageLevel::dataWindow(pIVar7);
  iVar2 = (pBVar8->min).x;
  iVar6 = ImageChannel::xSampling(in_RDI);
  in_RDI[1]._level =
       (ImageLevel *)
       ((long)pp_Var3 + (long)(iVar2 / iVar6) * -4 + (long)((iVar1 / iVar4) * iVar5) * -4);
  return;
}

Assistant:

void
TypedFlatImageChannel<T>::resetBasePointer ()
{
    _base = _pixels -
            (level ().dataWindow ().min.y / ySampling ()) * pixelsPerRow () -
            (level ().dataWindow ().min.x / xSampling ());
}